

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_arena.pb.cc
# Opt level: O0

void __thiscall proto2_arena_unittest::ArenaMessage::Clear(ArenaMessage *this)

{
  uint32_t cached_has_bits;
  ArenaMessage *this_local;
  
  google::protobuf::RepeatedPtrField<proto2_arena_unittest::NestedMessage>::Clear
            (&(this->field_0)._impl_.repeated_nested_message_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ArenaMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_arena_unittest.ArenaMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_nested_message_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}